

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs1(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *ufb,
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lfb)

{
  int iVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  Status stat;
  int i;
  Desc *ds;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffe88;
  Status in_stack_fffffffffffffe8c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe90;
  undefined1 local_140 [16];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffed0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffed8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffee0;
  allocator local_e9;
  string local_e8 [32];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8;
  Status local_90;
  int local_8c;
  Desc *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_88 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(in_RDI + 0x1f0));
  local_8c = 0;
  do {
    iVar1 = local_8c;
    iVar4 = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x2f0230);
    if (iVar4 <= iVar1) {
      return;
    }
    local_90 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::Desc::status((Desc *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    bVar2 = isBasic(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    if (!bVar2) {
      local_68 = &local_c8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe90);
      switch(local_90) {
      case P_FIXED:
      case D_ON_BOTH:
        local_60 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        local_58 = &local_c8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"ESVECS03 ERROR: ");
        poVar5 = std::operator<<(poVar5,"inconsistent basis must not happen!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,"XSVECS04 This should never happen.",&local_e9);
        SPxInternalCodeException::SPxInternalCodeException
                  ((SPxInternalCodeException *)in_stack_fffffffffffffe90,
                   (string *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      case P_ON_LOWER:
      case D_ON_LOWER:
        local_50 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        local_48 = &local_c8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        break;
      case P_ON_UPPER:
      case D_ON_UPPER:
        local_40 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        local_38 = &local_c8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        break;
      case P_FREE:
      case D_FREE:
      case D_UNDEFINED:
        goto LAB_002f056f;
      }
      tVar3 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                         (double *)0x2f04b0);
      if (tVar3) {
        in_stack_fffffffffffffe90 =
             *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **)(in_RDI + 0xa40);
        local_20 = local_140;
        local_28 = &local_c8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_29,local_28);
        local_10 = local_140;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_8 = local_140;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe90);
        vector(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      }
    }
LAB_002f056f:
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}